

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * nlohmann::json_abi_v3_11_3::detail::exception::name
                   (string *__return_storage_ptr__,string *ename,int id_)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string __str;
  char (*in_stack_ffffffffffffff98) [3];
  undefined1 local_59 [25];
  long local_40 [2];
  
  local_59[0] = 0x2e;
  __val = -id_;
  if (0 < id_) {
    __val = id_;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_0014a669;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_0014a669;
      }
      if (uVar2 < 10000) goto LAB_0014a669;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_0014a669:
  local_59._1_8_ = ename;
  local_59._9_8_ = local_40;
  std::__cxx11::string::_M_construct((ulong)(local_59 + 9),(char)__len - (char)(id_ >> 0x1f));
  inja::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)id_ >> 0x1f) + local_59._9_8_),__len,__val);
  concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[3]>
            (__return_storage_ptr__,(detail *)"[json.exception.",(char (*) [17])local_59._1_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59,
             local_59 + 9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18e575,
             in_stack_ffffffffffffff98);
  if ((long *)local_59._9_8_ != local_40) {
    operator_delete((void *)local_59._9_8_,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return concat("[json.exception.", ename, '.', std::to_string(id_), "] ");
    }